

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestPartResult
          (StreamingListener *this,TestPartResult *test_part_result)

{
  StreamingListener *pSVar1;
  char *in_RDX;
  char *str;
  StreamingListener *this_00;
  String SStack_68;
  string local_58;
  string local_38;
  
  pSVar1 = (StreamingListener *)(test_part_result->file_name_).c_str_;
  this_00 = (StreamingListener *)0x137e0f;
  if (pSVar1 != (StreamingListener *)0x0) {
    this_00 = pSVar1;
  }
  UrlEncode_abi_cxx11_(&local_38,this_00,in_RDX);
  String::Format((char *)&SStack_68,"event=TestPartResult&file=%s&line=%d&message=",
                 local_38._M_dataplus._M_p,(ulong)(uint)test_part_result->line_number_);
  String::operator_cast_to_string(&local_58,&SStack_68);
  Send(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  String::~String(&SStack_68);
  std::__cxx11::string::~string((string *)&local_38);
  UrlEncode_abi_cxx11_(&local_38,(StreamingListener *)(test_part_result->message_).c_str_,str);
  std::operator+(&local_58,&local_38,"\n");
  Send(this,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void OnTestPartResult(const TestPartResult& test_part_result) {
    const char* file_name = test_part_result.file_name();
    if (file_name == NULL)
      file_name = "";
    Send(String::Format("event=TestPartResult&file=%s&line=%d&message=",
                        UrlEncode(file_name).c_str(),
                        test_part_result.line_number()));
    Send(UrlEncode(test_part_result.message()) + "\n");
  }